

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

float Am_Linear_Timing_proc(Am_Object *interp,Am_Time *t)

{
  Am_Value *in_value;
  unsigned_long uVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  unsigned_long total_ms;
  unsigned_long t_ms;
  Am_Time total_time;
  Am_Time *t_local;
  Am_Object *interp_local;
  
  total_time.data = (Am_Time_Data *)t;
  in_value = Am_Object::Get(interp,0xff,0);
  Am_Time::Am_Time((Am_Time *)&t_ms,in_value);
  uVar1 = Am_Time::Milliseconds(t);
  uVar2 = Am_Time::Milliseconds((Am_Time *)&t_ms);
  if (uVar1 < uVar2) {
    auVar3._8_4_ = (int)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    auVar4._8_4_ = (int)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = 0x45300000;
    interp_local._4_4_ =
         (float)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
  }
  else {
    interp_local._4_4_ = 1.0;
  }
  Am_Time::~Am_Time((Am_Time *)&t_ms);
  return interp_local._4_4_;
}

Assistant:

Am_Define_Method(Am_Timing_Function, float, Am_Linear_Timing,
                 (Am_Object interp, Am_Time t))
{
  Am_Time total_time = interp.Get(Am_CURRENT_DURATION);

  unsigned long t_ms = t.Milliseconds();
  unsigned long total_ms = total_time.Milliseconds();

  if (t_ms >= total_ms)
    return 1.0;
  else
    return (float)((double)t_ms / (double)total_ms);
}